

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_handle.cpp
# Opt level: O1

peer_class_type_filter * __thiscall
libtorrent::session_handle::
sync_call_ret<libtorrent::peer_class_type_filter,libtorrent::peer_class_type_filter(libtorrent::aux::session_impl::*)()>
          (peer_class_type_filter *__return_storage_ptr__,session_handle *this,
          offset_in_session_impl_to_subr f)

{
  int iVar1;
  session_impl *ses;
  int iVar2;
  undefined8 uVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  bool bVar4;
  bool done;
  exception_ptr ex;
  bool local_71;
  exception_ptr local_70;
  void *local_68;
  type_conflict7 local_60;
  io_context *local_28;
  undefined4 local_1c;
  
  this_00 = (this->m_impl).
            super___weak_ptr<libtorrent::aux::session_impl,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    iVar2 = this_00->_M_use_count;
    do {
      if (iVar2 == 0) {
        this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        break;
      }
      LOCK();
      iVar1 = this_00->_M_use_count;
      bVar4 = iVar2 == iVar1;
      if (bVar4) {
        this_00->_M_use_count = iVar2 + 1;
        iVar1 = iVar2;
      }
      iVar2 = iVar1;
      UNLOCK();
    } while (!bVar4);
  }
  if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    bVar4 = true;
  }
  else {
    bVar4 = this_00->_M_use_count == 0;
  }
  if ((bVar4) ||
     (ses = (this->m_impl).
            super___weak_ptr<libtorrent::aux::session_impl,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
     ses == (session_impl *)0x0)) {
    local_60.r = (peer_class_type_filter *)CONCAT44(local_60.r._4_4_,0x73);
    aux::throw_ex<boost::system::system_error,libtorrent::errors::error_code_enum>
              ((error_code_enum *)&local_60);
  }
  local_60.done = &local_71;
  local_71 = false;
  (__return_storage_ptr__->m_peer_class_type_mask)._M_elems[0] = 0xffffffff;
  (__return_storage_ptr__->m_peer_class_type_mask)._M_elems[1] = 0xffffffff;
  (__return_storage_ptr__->m_peer_class_type_mask)._M_elems[2] = 0xffffffff;
  (__return_storage_ptr__->m_peer_class_type_mask)._M_elems[3] = 0xffffffff;
  (__return_storage_ptr__->m_peer_class_type_mask)._M_elems[4] = 0xffffffff;
  (__return_storage_ptr__->m_peer_class_type_mask)._M_elems[5] = 0xffffffff;
  (__return_storage_ptr__->m_peer_class_type)._M_elems[0] = 0;
  (__return_storage_ptr__->m_peer_class_type)._M_elems[1] = 0;
  (__return_storage_ptr__->m_peer_class_type)._M_elems[2] = 0;
  (__return_storage_ptr__->m_peer_class_type)._M_elems[3] = 0;
  (__return_storage_ptr__->m_peer_class_type)._M_elems[4] = 0;
  (__return_storage_ptr__->m_peer_class_type)._M_elems[5] = 0;
  local_60.ex = &local_70;
  local_70._M_exception_object = (void *)0x0;
  local_28 = ses->m_io_context;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  local_1c = 0;
  local_60.r = __return_storage_ptr__;
  local_60.s.super___shared_ptr<libtorrent::aux::session_impl,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       ses;
  local_60.s.super___shared_ptr<libtorrent::aux::session_impl,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = this_00;
  local_60.f = f;
  boost::asio::io_context::basic_executor_type<std::allocator<void>,0u>::
  execute<libtorrent::session_handle::sync_call_ret<libtorrent::peer_class_type_filter,libtorrent::peer_class_type_filter(libtorrent::aux::session_impl::*)()>(libtorrent::peer_class_type_filter(libtorrent::aux::session_impl::*)())const::_lambda()_1_>
            ((basic_executor_type<std::allocator<void>,0u> *)&local_28,&local_60);
  if (local_60.s.super___shared_ptr<libtorrent::aux::session_impl,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_60.s.
               super___shared_ptr<libtorrent::aux::session_impl,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  aux::torrent_wait(&local_71,ses);
  if (local_70._M_exception_object != (void *)0x0) {
    local_68 = local_70._M_exception_object;
    ::std::__exception_ptr::exception_ptr::_M_addref();
    uVar3 = ::std::rethrow_exception((exception_ptr)&local_68);
    if (local_68 != (void *)0x0) {
      ::std::__exception_ptr::exception_ptr::_M_release();
    }
    if (local_70._M_exception_object != (void *)0x0) {
      ::std::__exception_ptr::exception_ptr::_M_release();
    }
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
    _Unwind_Resume(uVar3);
  }
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  return __return_storage_ptr__;
}

Assistant:

Ret session_handle::sync_call_ret(Fun f, Args&&... a) const
	{
		std::shared_ptr<session_impl> s = m_impl.lock();
		if (!s) aux::throw_ex<system_error>(errors::invalid_session_handle);

		// this is the flag to indicate the call has completed
		// capture them by pointer to allow everything to be captured by value
		// and simplify the capture expression
		bool done = false;
		Ret r;
		std::exception_ptr ex;
		dispatch(s->get_context(), [=, &r, &done, &ex]() mutable
		{
#ifndef BOOST_NO_EXCEPTIONS
			try {
#endif
				r = (s.get()->*f)(std::forward<Args>(a)...);
#ifndef BOOST_NO_EXCEPTIONS
			} catch (...) {
				ex = std::current_exception();
			}
#endif
			std::unique_lock<std::mutex> l(s->mut);
			done = true;
			s->cond.notify_all();
		});

		aux::torrent_wait(done, *s);
		if (ex) std::rethrow_exception(ex);
		return r;
	}